

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O0

OPJ_BOOL bmp_read_rle8_data(FILE *IN,OPJ_UINT8 *pData,OPJ_UINT32 stride,OPJ_UINT32 width,
                           OPJ_UINT32 height)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  int iStack_5c;
  OPJ_UINT8 c1_1;
  int c1_int_1;
  int j_1;
  int iStack_50;
  OPJ_UINT8 c1;
  int c1_int;
  int j;
  int c;
  OPJ_UINT8 *beyond;
  OPJ_UINT8 *pix;
  OPJ_UINT32 written;
  OPJ_UINT32 y;
  OPJ_UINT32 x;
  OPJ_UINT32 height_local;
  OPJ_UINT32 width_local;
  OPJ_UINT32 stride_local;
  OPJ_UINT8 *pData_local;
  FILE *IN_local;
  
  pix._0_4_ = 0;
  pix._4_4_ = 0;
  written = 0;
  beyond = pData;
  while (pix._4_4_ < height) {
    iVar1 = getc((FILE *)IN);
    if (iVar1 == -1) {
      return 0;
    }
    if (iVar1 == 0) {
      uVar3 = getc((FILE *)IN);
      if (uVar3 == 0xffffffff) {
        return 0;
      }
      if (uVar3 == 0) {
        written = 0;
        pix._4_4_ = pix._4_4_ + 1;
        beyond = pData + pix._4_4_ * stride;
      }
      else {
        if (uVar3 == 1) break;
        if (uVar3 == 2) {
          iVar1 = getc((FILE *)IN);
          if (iVar1 == -1) {
            return 0;
          }
          written = iVar1 + written;
          iVar1 = getc((FILE *)IN);
          if (iVar1 == -1) {
            return 0;
          }
          pix._4_4_ = iVar1 + pix._4_4_;
          beyond = pData + (ulong)written + (ulong)(pix._4_4_ * stride);
        }
        else {
          iStack_5c = 0;
          while( true ) {
            bVar4 = false;
            if ((iStack_5c < (int)uVar3) && (bVar4 = false, written < width)) {
              bVar4 = beyond < pData + stride * height;
            }
            if (!bVar4) break;
            iVar1 = getc((FILE *)IN);
            if (iVar1 == -1) {
              return 0;
            }
            *beyond = (OPJ_UINT8)iVar1;
            pix._0_4_ = (int)pix + 1;
            iStack_5c = iStack_5c + 1;
            written = written + 1;
            beyond = beyond + 1;
          }
          if (((uVar3 & 1) != 0) && (iVar1 = getc((FILE *)IN), iVar1 == -1)) {
            return 0;
          }
        }
      }
    }
    else {
      iVar2 = getc((FILE *)IN);
      if (iVar2 == -1) {
        return 0;
      }
      iStack_50 = 0;
      while( true ) {
        bVar4 = false;
        if ((iStack_50 < iVar1) && (bVar4 = false, written < width)) {
          bVar4 = beyond < pData + stride * height;
        }
        if (!bVar4) break;
        *beyond = (OPJ_UINT8)iVar2;
        pix._0_4_ = (int)pix + 1;
        iStack_50 = iStack_50 + 1;
        written = written + 1;
        beyond = beyond + 1;
      }
    }
  }
  if ((int)pix != width * height) {
    fprintf(_stderr,"warning, image\'s actual size does not match advertized one\n");
    return 0;
  }
  return 1;
}

Assistant:

static OPJ_BOOL bmp_read_rle8_data(FILE* IN, OPJ_UINT8* pData,
                                   OPJ_UINT32 stride, OPJ_UINT32 width, OPJ_UINT32 height)
{
    OPJ_UINT32 x, y, written;
    OPJ_UINT8 *pix;
    const OPJ_UINT8 *beyond;

    beyond = pData + stride * height;
    pix = pData;

    x = y = written = 0U;
    while (y < height) {
        int c = getc(IN);
        if (c == EOF) {
            return OPJ_FALSE;
        }

        if (c) {
            int j, c1_int;
            OPJ_UINT8 c1;

            c1_int = getc(IN);
            if (c1_int == EOF) {
                return OPJ_FALSE;
            }
            c1 = (OPJ_UINT8)c1_int;

            for (j = 0; (j < c) && (x < width) &&
                    ((OPJ_SIZE_T)pix < (OPJ_SIZE_T)beyond); j++, x++, pix++) {
                *pix = c1;
                written++;
            }
        } else {
            c = getc(IN);
            if (c == EOF) {
                return OPJ_FALSE;
            }

            if (c == 0x00) { /* EOL */
                x = 0;
                ++y;
                pix = pData + y * stride + x;
            } else if (c == 0x01) { /* EOP */
                break;
            } else if (c == 0x02) { /* MOVE by dxdy */
                c = getc(IN);
                if (c == EOF) {
                    return OPJ_FALSE;
                }
                x += (OPJ_UINT32)c;
                c = getc(IN);
                if (c == EOF) {
                    return OPJ_FALSE;
                }
                y += (OPJ_UINT32)c;
                pix = pData + y * stride + x;
            } else { /* 03 .. 255 */
                int j;
                for (j = 0; (j < c) && (x < width) &&
                        ((OPJ_SIZE_T)pix < (OPJ_SIZE_T)beyond); j++, x++, pix++) {
                    int c1_int;
                    OPJ_UINT8 c1;
                    c1_int = getc(IN);
                    if (c1_int == EOF) {
                        return OPJ_FALSE;
                    }
                    c1 = (OPJ_UINT8)c1_int;
                    *pix = c1;
                    written++;
                }
                if ((OPJ_UINT32)c & 1U) { /* skip padding byte */
                    c = getc(IN);
                    if (c == EOF) {
                        return OPJ_FALSE;
                    }
                }
            }
        }
    }/* while() */

    if (written != width * height) {
        fprintf(stderr, "warning, image's actual size does not match advertized one\n");
        return OPJ_FALSE;
    }

    return OPJ_TRUE;
}